

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Function * __thiscall Parser::function(Parser *this)

{
  ExprNode *this_00;
  Statements *statements;
  Function *this_01;
  undefined8 extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  Token closeParen;
  Token openParen;
  Token colon;
  Token def;
  string local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  Token local_250;
  Token local_1e0;
  Token local_170;
  Token local_100;
  Token local_90;
  
  Tokenizer::getToken(&local_90,this->tokenizer);
  this_00 = variableID(this);
  Tokenizer::getToken(&local_170,this->tokenizer);
  if (local_170._symbol == '(') {
    parameterList_abi_cxx11_(&local_328,this);
    Tokenizer::getToken(&local_250,this->tokenizer);
    if (local_250._symbol == ')') {
      Tokenizer::getToken(&local_100,this->tokenizer);
      if (local_250._symbol == ')') {
        statements = suite(this);
        this_01 = (Function *)operator_new(0x88);
        ExprNode::token(&local_1e0,this_00);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_360,local_1e0._name._M_dataplus._M_p,
                   local_1e0._name._M_dataplus._M_p + local_1e0._name._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_340,&local_328);
        Function::Function(this_01,&local_360,&local_340,statements);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._string._M_dataplus._M_p != &local_1e0._string.field_2) {
          operator_delete(local_1e0._string._M_dataplus._M_p,
                          local_1e0._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._relOp._M_dataplus._M_p != &local_1e0._relOp.field_2) {
          operator_delete(local_1e0._relOp._M_dataplus._M_p,
                          local_1e0._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._name._M_dataplus._M_p != &local_1e0._name.field_2) {
          operator_delete(local_1e0._name._M_dataplus._M_p,
                          local_1e0._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._string._M_dataplus._M_p != &local_100._string.field_2) {
          operator_delete(local_100._string._M_dataplus._M_p,
                          local_100._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._relOp._M_dataplus._M_p != &local_100._relOp.field_2) {
          operator_delete(local_100._relOp._M_dataplus._M_p,
                          local_100._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._name._M_dataplus._M_p != &local_100._name.field_2) {
          operator_delete(local_100._name._M_dataplus._M_p,
                          local_100._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._string._M_dataplus._M_p != &local_250._string.field_2) {
          operator_delete(local_250._string._M_dataplus._M_p,
                          local_250._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._relOp._M_dataplus._M_p != &local_250._relOp.field_2) {
          operator_delete(local_250._relOp._M_dataplus._M_p,
                          local_250._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._name._M_dataplus._M_p != &local_250._name.field_2) {
          operator_delete(local_250._name._M_dataplus._M_p,
                          local_250._name.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._string._M_dataplus._M_p != &local_170._string.field_2) {
          operator_delete(local_170._string._M_dataplus._M_p,
                          local_170._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._relOp._M_dataplus._M_p != &local_170._relOp.field_2) {
          operator_delete(local_170._relOp._M_dataplus._M_p,
                          local_170._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._name._M_dataplus._M_p != &local_170._name.field_2) {
          operator_delete(local_170._name._M_dataplus._M_p,
                          local_170._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
          operator_delete(local_90._string._M_dataplus._M_p,
                          local_90._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._relOp._M_dataplus._M_p != &local_90._relOp.field_2) {
          operator_delete(local_90._relOp._M_dataplus._M_p,
                          local_90._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
          operator_delete(local_90._name._M_dataplus._M_p,
                          local_90._name.field_2._M_allocated_capacity + 1);
        }
        return this_01;
      }
      goto LAB_0010a100;
    }
  }
  else {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Parser::functionDef","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,"Expected an ( sign, instead got","");
    die(this,&local_270,&local_290,&local_170);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Parser::functionDef","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,"Expected an ) sign, instead got","");
  die(this,&local_2b0,&local_2d0,&local_250);
LAB_0010a100:
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Parser::functionDef","");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_310,"Expected an : sign, instead got","");
  die(this,&local_2f0,&local_310,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(&local_100);
  Token::~Token(&local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  Token::~Token(&local_170);
  Token::~Token(&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Function *Parser::function(){
    Token def = tokenizer.getToken();
    ExprNode *id = variableID();
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::functionDef", "Expected an ( sign, instead got", openParen);
    //Parameter List
    std::vector<std::string>params = parameterList();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an ) sign, instead got", closeParen);
    Token colon = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an : sign, instead got", colon);
    Statements *statements = suite();
    return new Function(id->token().getName(),params,statements);

}